

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerators::Run(cmQtAutoGenerators *this,string *targetDirectory,string *config)

{
  bool bVar1;
  bool bVar2;
  cmMakefile *this_00;
  auto_ptr<cmMakefile> mf;
  Snapshot snapshot;
  cmake cm;
  cmGlobalGenerator gg;
  Directory local_850;
  Snapshot local_828;
  cmake local_808;
  undefined1 local_558 [16];
  _Alloc_hider local_548;
  cmMakefile *local_4b0;
  
  cmake::cmake(&local_808);
  cmake::SetHomeOutputDirectory(&local_808,targetDirectory);
  cmake::SetHomeDirectory(&local_808,targetDirectory);
  local_548._M_p = (pointer)local_808.CurrentSnapshot.Position.Position;
  local_558._0_8_ = local_808.CurrentSnapshot.State;
  local_558._8_8_ = local_808.CurrentSnapshot.Position.Tree;
  cmState::Snapshot::SetDefaultDefinitions((Snapshot *)local_558);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_558,&local_808);
  local_828.Position.Position = local_808.CurrentSnapshot.Position.Position;
  local_828.State = local_808.CurrentSnapshot.State;
  local_828.Position.Tree = local_808.CurrentSnapshot.Position.Tree;
  cmState::Snapshot::GetDirectory(&local_850,&local_828);
  cmState::Directory::SetCurrentBinary(&local_850,targetDirectory);
  cmState::Snapshot::GetDirectory(&local_850,&local_828);
  cmState::Directory::SetCurrentSource(&local_850,targetDirectory);
  this_00 = (cmMakefile *)operator_new(0x730);
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)local_558,&local_828);
  local_850.DirectoryState.Tree = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)this_00;
  local_4b0 = this_00;
  ReadAutogenInfoFile(this,this_00,targetDirectory,config);
  ReadOldMocDefinitionsFile(this,this_00,targetDirectory);
  Init(this);
  bVar1 = std::operator==(&this->QtMajorVersion,"4");
  if (!bVar1) {
    bVar1 = std::operator==(&this->QtMajorVersion,"5");
    bVar2 = true;
    if (!bVar1) goto LAB_002989bb;
  }
  bVar2 = RunAutogen(this,(cmMakefile *)local_850.DirectoryState.Tree);
LAB_002989bb:
  WriteOldMocDefinitionsFile(this,targetDirectory);
  cmsys::auto_ptr<cmMakefile>::~auto_ptr((auto_ptr<cmMakefile> *)&local_850);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_558);
  cmake::~cmake(&local_808);
  return bVar2;
}

Assistant:

bool cmQtAutoGenerators::Run(const std::string& targetDirectory,
                             const std::string& config)
{
  bool success = true;
  cmake cm;
  cm.SetHomeOutputDirectory(targetDirectory);
  cm.SetHomeDirectory(targetDirectory);
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);

  cmState::Snapshot snapshot = cm.GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(targetDirectory);
  snapshot.GetDirectory().SetCurrentSource(targetDirectory);

  cmsys::auto_ptr<cmMakefile> mf(new cmMakefile(&gg, snapshot));
  gg.SetCurrentMakefile(mf.get());

  this->ReadAutogenInfoFile(mf.get(), targetDirectory, config);
  this->ReadOldMocDefinitionsFile(mf.get(), targetDirectory);

  this->Init();

  if (this->QtMajorVersion == "4" || this->QtMajorVersion == "5")
    {
    success = this->RunAutogen(mf.get());
    }

  this->WriteOldMocDefinitionsFile(targetDirectory);

  return success;
}